

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mul(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 pTVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *ts;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_5;
  uintptr_t o_4;
  TCGv_i64 ret;
  uintptr_t o_3;
  TCGv_i64 arg1;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  arg1 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1_00 - (long)s);
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  uVar2 = ctx->opcode;
  pTVar1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar2 >> 0xd & 0xf8));
  if (pTVar1 != arg1) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(pTVar1 + (long)s));
    uVar2 = ctx->opcode;
  }
  pTVar1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar2 >> 8 & 0xf8));
  if (pTVar1 != ret) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(pTVar1 + (long)s));
  }
  tcg_gen_op3_ppc64(s,INDEX_op_mul_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a1_00);
  if (ts != a1) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)ts,(TCGArg)a1);
  }
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0xb18);
  tcg_gen_shri_i64_ppc64(s,ret,arg1,0x20);
  pTVar1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  if (pTVar1 != ret) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)(pTVar1 + (long)s),(TCGArg)a1_00);
  }
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(arg1 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_ppc64(s,ts);
  if ((ctx->opcode & 1) != 0) {
    gen_mul_cold_1();
  }
  return;
}

Assistant:

static void gen_mul(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_extu_tl_i64(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);
    tcg_gen_trunc_i64_tl(tcg_ctx, t2, t0);
    gen_store_spr(tcg_ctx, SPR_MQ, t2);
    tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
    tcg_gen_trunc_i64_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t1);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}